

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::AffineTransform::dim_forward
          (Dim *__return_storage_ptr__,AffineTransform *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  invalid_argument *piVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pDVar1 >> 2) * -0x71c71c71c71c71c7;
  if ((uVar6 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Bad number of inputs in AffineTransform: ",0x29);
    operator<<((ostream *)local_190,xs);
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar5,local_1b0);
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __return_storage_ptr__->bd = pDVar1->bd;
  uVar2 = *(undefined8 *)(pDVar1->d + 2);
  uVar3 = *(undefined8 *)(pDVar1->d + 4);
  uVar4 = *(undefined8 *)(pDVar1->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar1->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
  if (1 < uVar6) {
    uVar7 = __return_storage_ptr__->bd;
    uVar9 = 1;
    uVar8 = 2;
    do {
      uVar10 = 1;
      if (1 < pDVar1[uVar9].nd) {
        uVar10 = pDVar1[uVar9].d[1];
      }
      if ((uVar10 != pDVar1[uVar8].d[0]) || (pDVar1->d[0] != pDVar1[uVar9].d[0])) {
LAB_0021ea3a:
        __return_storage_ptr__->bd = uVar7;
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Bad dimensions for AffineTransform: ",0x24);
        operator<<((ostream *)local_190,xs);
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar5,local_1b0);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      uVar11 = 1;
      uVar10 = 1;
      if (1 < pDVar1->nd) {
        uVar10 = pDVar1->d[1];
      }
      if (1 < pDVar1[uVar8].nd) {
        uVar11 = pDVar1[uVar8].d[1];
      }
      if (uVar10 != uVar11) goto LAB_0021ea3a;
      uVar10 = pDVar1[uVar9].bd;
      if (uVar7 <= uVar10) {
        uVar7 = uVar10;
      }
      uVar9 = (ulong)(uVar8 + 1);
      if (uVar7 <= pDVar1[uVar8].bd) {
        uVar7 = pDVar1[uVar8].bd;
      }
      uVar8 = uVar8 + 2;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
    __return_storage_ptr__->bd = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

Dim AffineTransform::dim_forward(const vector<Dim>& xs) const {
  if ((xs.size() - 1) % 2 != 0) {
    ostringstream s; s << "Bad number of inputs in AffineTransform: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d = xs[0];
  for (unsigned i = 1; i < xs.size(); i += 2) {
    if (xs[i].cols() != xs[i+1].rows() ||
        xs[0].rows() != xs[i].rows() ||
        xs[0].cols() != xs[i+1].cols()) {
      ostringstream s; s << "Bad dimensions for AffineTransform: " << xs;
      throw std::invalid_argument(s.str());
    }
    d.bd = max(max(d.bd, xs[i].bd), xs[i+1].bd);
  }
  return d;
}